

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PickLoadSigns.cpp
# Opt level: O0

void __thiscall wasm::PickLoadSigns::optimize(PickLoadSigns *this)

{
  bool bVar1;
  reference __in;
  type *ppLVar2;
  type *ptVar3;
  reference pvVar4;
  value_type *usage;
  type *index;
  type *load;
  _Node_iterator_base<std::pair<wasm::Load_*const,_unsigned_int>,_false> local_28;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::Load_*,_unsigned_int,_std::hash<wasm::Load_*>,_std::equal_to<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>_>
  *__range2;
  PickLoadSigns *this_local;
  
  __end2 = std::
           unordered_map<wasm::Load_*,_unsigned_int,_std::hash<wasm::Load_*>,_std::equal_to<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>_>
           ::begin(&this->loads);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Load_*,_unsigned_int,_std::hash<wasm::Load_*>,_std::equal_to<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>_>
       ::end(&this->loads);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<wasm::Load_*const,_unsigned_int>,_false>
                            ,&local_28), bVar1) {
    __in = std::__detail::_Node_iterator<std::pair<wasm::Load_*const,_unsigned_int>,_false,_false>::
           operator*(&__end2);
    ppLVar2 = std::get<0ul,wasm::Load*const,unsigned_int>(__in);
    ptVar3 = std::get<1ul,wasm::Load*const,unsigned_int>(__in);
    pvVar4 = std::vector<wasm::PickLoadSigns::Usage,_std::allocator<wasm::PickLoadSigns::Usage>_>::
             operator[](&this->usages,(ulong)*ptVar3);
    if ((((pvVar4->totalUsages != 0) &&
         (pvVar4->signedUsages + pvVar4->unsignedUsages == pvVar4->totalUsages)) &&
        ((pvVar4->signedUsages == 0 || (pvVar4->signedBits == (uint)(*ppLVar2)->bytes << 3)))) &&
       (((pvVar4->unsignedUsages == 0 || (pvVar4->unsignedBits == (uint)(*ppLVar2)->bytes << 3)) &&
        (((*ppLVar2)->isAtomic & 1U) == 0)))) {
      (*ppLVar2)->signed_ = pvVar4->unsignedUsages <= pvVar4->signedUsages << 1;
    }
    std::__detail::_Node_iterator<std::pair<wasm::Load_*const,_unsigned_int>,_false,_false>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void optimize() {
    // optimize based on the info we saw
    for (auto& [load, index] : loads) {
      auto& usage = usages[index];
      // if we can't optimize, give up
      if (usage.totalUsages == 0 || // no usages, so no idea
          usage.signedUsages + usage.unsignedUsages !=
            usage.totalUsages || // non-sign/unsigned usages, so cannot change
          (usage.signedUsages != 0 &&
           usage.signedBits !=
             load->bytes * 8) || // sign usages exist but the wrong size
          (usage.unsignedUsages != 0 &&
           usage.unsignedBits !=
             load->bytes * 8)) { // unsigned usages exist but the wrong size
        continue;
      }
      // Atomic operations are always unsigned, never signed.
      if (load->isAtomic) {
        continue;
      }
      // we can pick the optimal one. our hope is to remove 2 items per
      // signed use (two shifts), so we factor that in
      load->signed_ = usage.signedUsages * 2 >= usage.unsignedUsages;
    }
  }